

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpMapMatrix.cpp
# Opt level: O0

void mnf::ExpMapMatrix::applyDiffPseudoLog0_
               (RefMat *out,ConstRefMat *in,ConstRefVec *x,ReusableTemporaryMap *m)

{
  undefined8 this;
  Index IVar1;
  Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_> *local_138;
  Matrix<double,_3,_9,_0,_3,_9> local_130;
  Product<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>
  local_58;
  undefined1 local_48 [8];
  Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_> a;
  ReusableTemporaryMap *m_local;
  ConstRefVec *x_local;
  ConstRefMat *in_local;
  RefMat *out_local;
  
  a._24_8_ = m;
  IVar1 = Eigen::
          MapBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
          ::cols((MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  *)in);
  mnf_assert(IVar1 == 3);
  this = a._24_8_;
  IVar1 = Eigen::
          MapBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
          ::rows((MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  *)in);
  ReusableTemporaryMap::getMap
            ((Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_> *)local_48,
             (ReusableTemporaryMap *)this,IVar1,9);
  diffPseudoLog0_(&local_130,x);
  local_58 = Eigen::
             MatrixBase<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>>
             ::operator*((MatrixBase<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>>>
                          *)in,(MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)&local_130);
  local_138 = (Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_> *)
              Eigen::
              MatrixBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_16,_Eigen::Stride<0,_0>_>_>
              ::noalias((MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_>_>
                         *)local_48);
  Eigen::
  NoAlias<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,16,Eigen::Stride<0,0>>,Eigen::MatrixBase>::
  operator=((NoAlias<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,16,Eigen::Stride<0,0>>,Eigen::MatrixBase>
             *)&local_138,
            (MatrixBase<Eigen::Product<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>_>
             *)&local_58);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>::operator=
            ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>> *)out,
             (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_>_>
              *)local_48);
  return;
}

Assistant:

void ExpMapMatrix::applyDiffPseudoLog0_(RefMat out, const ConstRefMat& in,
                                        const ConstRefVec& x,
                                        ReusableTemporaryMap& m)
{
  mnf_assert(in.cols() == InputDim_ && "Dimensions mismatch");
  Eigen::Map<Eigen::MatrixXd, Eigen::Aligned> a =
      m.getMap(in.rows(), OutputDim_);
  a.noalias() = in * diffPseudoLog0_(x);
  out = a;
}